

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void snowhouse::ConfigurableAssert<snowhouse::DefaultFailureHandler>::
     That<int,snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>
               (int *actual,
               ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,_snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>_>,_snowhouse::Nil>_>_>
               *expression,char *file_name,int line_number)

{
  bool bVar1;
  reference ppCVar2;
  InvalidExpressionException *this;
  reference pvVar3;
  InvalidExpressionException *e;
  string local_100 [32];
  value_type local_e0;
  ConstraintOperator *op;
  OperatorStack operators;
  undefined1 local_78 [8];
  ResultStack result;
  int line_number_local;
  char *file_name_local;
  ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,_snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>_>,_snowhouse::Nil>_>_>
  *expression_local;
  int *actual_local;
  
  result.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._4_4_ = line_number;
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>
            ((stack<bool,std::deque<bool,std::allocator<bool>>> *)local_78);
  std::
  stack<snowhouse::ConstraintOperator*,std::deque<snowhouse::ConstraintOperator*,std::allocator<snowhouse::ConstraintOperator*>>>
  ::
  stack<std::deque<snowhouse::ConstraintOperator*,std::allocator<snowhouse::ConstraintOperator*>>,void>
            ((stack<snowhouse::ConstraintOperator*,std::deque<snowhouse::ConstraintOperator*,std::allocator<snowhouse::ConstraintOperator*>>>
              *)&op);
  ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,_snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>_>,_snowhouse::Nil>_>_>
  ::Evaluate<int>(expression,(ResultStack *)local_78,(OperatorStack *)&op,actual);
  while( true ) {
    bVar1 = std::
            stack<snowhouse::ConstraintOperator_*,_std::deque<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>_>
            ::empty((stack<snowhouse::ConstraintOperator_*,_std::deque<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>_>
                     *)&op);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppCVar2 = std::
              stack<snowhouse::ConstraintOperator_*,_std::deque<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>_>
              ::top((stack<snowhouse::ConstraintOperator_*,_std::deque<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>_>
                     *)&op);
    local_e0 = *ppCVar2;
    (**local_e0->_vptr_ConstraintOperator)(local_e0,local_78);
    std::
    stack<snowhouse::ConstraintOperator_*,_std::deque<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>_>
    ::pop((stack<snowhouse::ConstraintOperator_*,_std::deque<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>_>
           *)&op);
  }
  bVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::empty
                    ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)local_78);
  if (!bVar1) {
    pvVar3 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top
                       ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)local_78);
    if ((*pvVar3 & 1U) == 0) {
      DefaultFailureHandler::
      Handle<snowhouse::ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>,int>
                (expression,actual,file_name,
                 result.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node._4_4_);
    }
    std::
    stack<snowhouse::ConstraintOperator_*,_std::deque<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>_>
    ::~stack((stack<snowhouse::ConstraintOperator_*,_std::deque<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>_>
              *)&op);
    std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::~stack
              ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)local_78);
    return;
  }
  e._6_1_ = 1;
  this = (InvalidExpressionException *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_100,"The expression did not yield any result",(allocator *)((long)&e + 7));
  InvalidExpressionException::InvalidExpressionException(this,(string *)local_100);
  e._6_1_ = 0;
  __cxa_throw(this,&InvalidExpressionException::typeinfo,
              InvalidExpressionException::~InvalidExpressionException);
}

Assistant:

static void That(const ActualType& actual, ExpressionBuilder<ConstraintListType> expression, const char* file_name, int line_number)
      {
         try 
         {
            ResultStack result;
            OperatorStack operators;
            expression.Evaluate(result, operators, actual);

            while (!operators.empty())
            {
               ConstraintOperator* op = operators.top();
               op->PerformOperation(result);
               operators.pop();
            }

            if (result.empty())
            {
               throw InvalidExpressionException("The expression did not yield any result");
            }

            if (!result.top())
            {
               FailureHandler::Handle(expression, actual, file_name, line_number);
            }      
         }
         catch (const InvalidExpressionException& e) 
         {
            FailureHandler::Handle("Malformed expression: \"" + snowhouse::Stringize(expression) + "\"\n" + e.Message());
         }
      }